

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::AMRLink::AMRLink(AMRLink *this,int dim,int level,int refinement,Bounds *core,Bounds *bounds)

{
  size_t in_RDI;
  Bounds *in_stack_00000090;
  Bounds *in_stack_00000098;
  Point *in_stack_000000a0;
  int in_stack_000000a8;
  int in_stack_000000ac;
  DynamicPoint<int,_4UL> *x;
  Coordinate in_stack_ffffffffffffff4c;
  DynamicPoint<int,_4UL> local_a8 [2];
  
  x = local_a8;
  DynamicPoint<int,_4UL>::one(in_RDI);
  diy::operator*(in_stack_ffffffffffffff4c,x);
  AMRLink((AMRLink *)bounds,in_stack_000000ac,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
          in_stack_00000090);
  DynamicPoint<int,_4UL>::~DynamicPoint((DynamicPoint<int,_4UL> *)0x1ff77a);
  DynamicPoint<int,_4UL>::~DynamicPoint((DynamicPoint<int,_4UL> *)0x1ff784);
  return;
}

Assistant:

AMRLink(int dim, int level, int refinement, const Bounds& core, const Bounds& bounds):
                        AMRLink(dim, level, refinement * Point::one(dim), core, bounds)     {}